

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_>::clear
          (array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_> *this)

{
  CSkinPart *pCVar1;
  
  if (this->list != (CSkinPart *)0x0) {
    operator_delete__(this->list);
  }
  this->list_size = 1;
  pCVar1 = (CSkinPart *)operator_new__(0x7c);
  pCVar1->m_OrgTexture = -1;
  pCVar1->m_ColorTexture = -1;
  this->list = pCVar1;
  this->num_elements = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}